

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O1

duckdb_state
duckdb_appender_create_ext
          (duckdb_connection connection,char *catalog,char *schema,char *table,
          duckdb_appender *out_appender)

{
  long *plVar1;
  long *plVar2;
  duckdb_appender p_Var3;
  duckdb_state dVar4;
  ErrorData error;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  long *local_a8 [16];
  
  dVar4 = DuckDBError;
  if (out_appender != (duckdb_appender *)0x0 &&
      (table != (char *)0x0 && connection != (duckdb_connection)0x0)) {
    local_b8 = catalog;
    if (catalog == (char *)0x0) {
      local_b8 = anon_var_dwarf_643533f + 9;
    }
    local_c0 = schema;
    if (schema == (char *)0x0) {
      local_c0 = "main";
    }
    local_b0 = table;
    p_Var3 = (duckdb_appender)operator_new(0x28);
    *(long *)p_Var3 = 0;
    *(long *)(p_Var3 + 8) = 0;
    *(long *)(p_Var3 + 0x10) = 0;
    *(long *)(p_Var3 + 0x18) = 0;
    *(long *)(p_Var3 + 0x20) = 0;
    *(duckdb_appender *)(p_Var3 + 8) = p_Var3 + 0x18;
    *(long *)(p_Var3 + 0x10) = 0;
    p_Var3[0x18] = (_duckdb_appender)0x0;
    *out_appender = p_Var3;
    duckdb::make_uniq<duckdb::Appender,duckdb::Connection&,char_const*&,char_const*&,char_const*&>
              ((duckdb *)local_a8,(Connection *)connection,&local_b8,&local_c0,&local_b0);
    plVar2 = local_a8[0];
    local_a8[0] = (long *)0x0;
    plVar1 = *(long **)p_Var3;
    *(long **)p_Var3 = plVar2;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if (local_a8[0] != (long *)0x0) {
      (**(code **)(*local_a8[0] + 8))();
    }
    dVar4 = DuckDBSuccess;
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_appender_create_ext(duckdb_connection connection, const char *catalog, const char *schema,
                                        const char *table, duckdb_appender *out_appender) {
	Connection *conn = reinterpret_cast<Connection *>(connection);

	if (!connection || !table || !out_appender) {
		return DuckDBError;
	}
	if (catalog == nullptr) {
		catalog = INVALID_CATALOG;
	}
	if (schema == nullptr) {
		schema = DEFAULT_SCHEMA;
	}

	auto wrapper = new AppenderWrapper();
	*out_appender = (duckdb_appender)wrapper;
	try {
		wrapper->appender = duckdb::make_uniq<Appender>(*conn, catalog, schema, table);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		wrapper->error = error.RawMessage();
		return DuckDBError;
	} catch (...) { // LCOV_EXCL_START
		wrapper->error = "Unknown create appender error";
		return DuckDBError;
	} // LCOV_EXCL_STOP
	return DuckDBSuccess;
}